

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O2

void __thiscall p2t::Triangle::MarkNeighbor(Triangle *this,Triangle *t)

{
  Point **ppPVar1;
  bool bVar2;
  long lVar3;
  Point **ppPVar4;
  Point **ppPVar5;
  
  ppPVar1 = this->points_ + 1;
  ppPVar4 = this->points_ + 2;
  bVar2 = Contains(t,this->points_[1],this->points_[2]);
  if (bVar2) {
    lVar3 = 0x20;
    ppPVar5 = ppPVar1;
  }
  else {
    ppPVar5 = this->points_;
    bVar2 = Contains(t,*ppPVar5,*ppPVar4);
    if (bVar2) {
      lVar3 = 0x28;
    }
    else {
      bVar2 = Contains(t,*ppPVar5,*ppPVar1);
      if (!bVar2) {
        return;
      }
      lVar3 = 0x30;
      ppPVar4 = ppPVar1;
    }
  }
  *(Triangle **)(this->constrained_edge + lVar3) = t;
  MarkNeighbor(t,*ppPVar5,*ppPVar4,this);
  return;
}

Assistant:

void Triangle::MarkNeighbor(Triangle& t)
{
  if (t.Contains(points_[1], points_[2])) {
    neighbors_[0] = &t;
    t.MarkNeighbor(points_[1], points_[2], this);
  } else if (t.Contains(points_[0], points_[2])) {
    neighbors_[1] = &t;
    t.MarkNeighbor(points_[0], points_[2], this);
  } else if (t.Contains(points_[0], points_[1])) {
    neighbors_[2] = &t;
    t.MarkNeighbor(points_[0], points_[1], this);
  }
}